

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O0

SRes SzReadStreamsInfo(CSzAr *p,CSzData *sd,UInt32 numFoldersMax,CBuf *tempBufs,UInt32 numTempBufs,
                      UInt64 *dataOffset,CSubStreamInfo *ssi,ISzAlloc *alloc)

{
  SRes SVar1;
  CSubStreamInfo *in_RCX;
  undefined4 in_EDX;
  CSzAr *in_RSI;
  long in_RDI;
  UInt64 *in_R9;
  int __result___7;
  int __result___6;
  int __result___5;
  int __result___4;
  int __result___3;
  int __result___2;
  int __result___1;
  int __result__;
  UInt64 type;
  ISzAlloc *in_stack_000000e0;
  UInt32 in_stack_000000ec;
  CBuf *in_stack_000000f0;
  UInt32 in_stack_000000fc;
  CSzData *in_stack_00000100;
  CSzAr *in_stack_00000108;
  UInt64 local_40;
  UInt64 *local_38;
  undefined4 in_stack_ffffffffffffffe0;
  SRes local_4;
  
  *(undefined8 *)(___result___7 + 6) = 0;
  *(undefined8 *)(___result___7 + 8) = 0;
  *(undefined8 *)(___result___7 + 10) = 0;
  *(undefined8 *)(___result___7 + 0xc) = 0;
  *(undefined8 *)(___result___7 + 2) = 0;
  *(undefined8 *)(___result___7 + 4) = 0;
  *in_R9 = 0;
  local_38 = in_R9;
  local_4 = ReadNumber((CSzData *)in_RSI,&local_40);
  if (((local_4 == 0) &&
      ((local_40 != 6 ||
       (((local_4 = ReadNumber((CSzData *)in_RSI,local_38), local_4 == 0 &&
         (local_4 = ReadPackInfo(in_RSI,(CSzData *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                                 (ISzAlloc *)in_RCX), local_4 == 0)) &&
        (local_4 = ReadNumber((CSzData *)in_RSI,&local_40), local_4 == 0)))))) &&
     ((local_40 != 7 ||
      ((local_4 = ReadUnpackInfo(in_stack_00000108,in_stack_00000100,in_stack_000000fc,
                                 in_stack_000000f0,in_stack_000000ec,in_stack_000000e0),
       local_4 == 0 && (local_4 = ReadNumber((CSzData *)in_RSI,&local_40), local_4 == 0)))))) {
    if (local_40 == 8) {
      SVar1 = ReadSubStreamsInfo(in_RSI,(CSzData *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX
                                );
      if (SVar1 != 0) {
        return SVar1;
      }
      SVar1 = ReadNumber((CSzData *)in_RSI,&local_40);
      if (SVar1 != 0) {
        return SVar1;
      }
    }
    else {
      *___result___7 = *(undefined4 *)(in_RDI + 4);
    }
    local_4 = 4;
    if (local_40 == 0) {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static SRes SzReadStreamsInfo(CSzAr *p,
    CSzData *sd,
    UInt32 numFoldersMax, const CBuf *tempBufs, UInt32 numTempBufs,
    UInt64 *dataOffset,
    CSubStreamInfo *ssi,
    ISzAlloc *alloc)
{
  UInt64 type;

  SzData_Clear(&ssi->sdSizes);
  SzData_Clear(&ssi->sdCRCs);
  SzData_Clear(&ssi->sdNumSubStreams);

  *dataOffset = 0;
  RINOK(ReadID(sd, &type));
  if (type == k7zIdPackInfo)
  {
    RINOK(ReadNumber(sd, dataOffset));
    RINOK(ReadPackInfo(p, sd, alloc));
    RINOK(ReadID(sd, &type));
  }
  if (type == k7zIdUnpackInfo)
  {
    RINOK(ReadUnpackInfo(p, sd, numFoldersMax, tempBufs, numTempBufs, alloc));
    RINOK(ReadID(sd, &type));
  }
  if (type == k7zIdSubStreamsInfo)
  {
    RINOK(ReadSubStreamsInfo(p, sd, ssi));
    RINOK(ReadID(sd, &type));
  }
  else
  {
    ssi->NumTotalSubStreams = p->NumFolders;
    // ssi->NumSubDigests = 0;
  }

  return (type == k7zIdEnd ? SZ_OK : SZ_ERROR_UNSUPPORTED);
}